

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
BailOutRecord::RestoreValue
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,Var *values
          ,ScriptContext *scriptContext,bool fromLoopBody,Var *registerSaves,
          InterpreterStackFrame *newInstance,Var *pArgumentsObject,void *argoutRestoreAddress,
          uint regSlot,int offset,bool isLocal,bool isFloat64,bool isInt32)

{
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  bool bVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  uint uVar7;
  uint uVar8;
  RegSlot RVar9;
  FunctionBody *pFVar10;
  undefined4 *puVar11;
  Var pvVar12;
  Var oldValue;
  char16_t *pcStack_78;
  uint constantIndex;
  char16 *name;
  Var pvStack_68;
  int32 int32Value;
  double dblValue;
  Var value;
  bool boxStackInstance;
  bool isInt32_local;
  bool isFloat64_local;
  bool isLocal_local;
  bool fromLoopBody_local;
  ScriptContext *scriptContext_local;
  Var *values_local;
  JavascriptCallStackLayout *layout_local;
  BailOutKind bailOutKind_local;
  BailOutRecord *this_local;
  Var local_18;
  
  bVar4 = true;
  dblValue = 0.0;
  pvStack_68 = (Var)0x0;
  name._4_4_ = 0;
  pcStack_78 = L"OutParam";
  if (isLocal) {
    pcStack_78 = L"Register";
  }
  if ((DAT_01ec73ca & 1) != 0) {
    pFVar10 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
    pFVar10 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
    if ((bVar2) &&
       ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
        (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
      Output::Print(L"BailOut:   %s #%3d: ",pcStack_78,(ulong)regSlot);
    }
  }
  if (offset < 0) {
    if (argoutRestoreAddress == (void *)0x0) {
      if (isFloat64) {
        pvStack_68 = (Var)Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
      }
      else if (isInt32) {
        name._4_4_ = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
      }
      else {
        dblValue = (double)Js::JavascriptCallStackLayout::GetOffset(layout,offset);
        pFVar10 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        bVar2 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar10);
        if (bVar2) {
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          bVar2 = Js::FunctionBody::IsNonTempLocalVar(pFVar10,regSlot);
          if ((bVar2) && ((Var)dblValue == (Var)0xcececececececece)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x379,
                               "(!(newInstance->function->GetFunctionBody()->IsInDebugMode() && newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) && value == (Js::Var)Func::c_debugFillPattern))"
                               ,
                               "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code."
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
      }
    }
    else if (!isLocal) {
      if ((isFloat64) || (isInt32)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,900,"(!isFloat64 && !isInt32)","!isFloat64 && !isInt32");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      dblValue = *(double *)((long)argoutRestoreAddress + (ulong)(regSlot << 3));
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      bVar2 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar10);
      if (bVar2) {
        pFVar10 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        bVar2 = Js::FunctionBody::IsNonTempLocalVar(pFVar10,regSlot);
        if ((bVar2) && (dblValue == -4.252558376500915e+71)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x38a,
                             "(!(newInstance->function->GetFunctionBody()->IsInDebugMode() && newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) && value == (Js::Var)Func::c_debugFillPattern))"
                             ,
                             "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code."
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
    }
    if ((DAT_01ec73ca & 1) != 0) {
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar2) &&
         ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
          (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
        Output::Print(L"Stack offset %6d",(ulong)(uint)offset);
      }
    }
  }
  else {
    if (offset < 1) {
      if ((DAT_01ec73ca & 1) == 0) {
        return;
      }
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if (!bVar4) {
        return;
      }
      bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8);
      if ((!bVar4) &&
         (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), !bVar4)) {
        return;
      }
      Output::Print(L"Not live\n");
      return;
    }
    uVar5 = GetBailOutRegisterSaveSlotCount();
    if (uVar5 < (uint)offset) {
      bVar4 = IsArgumentsObject(offset);
      if (bVar4) {
        if (isFloat64) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3b4,"(!isFloat64)","!isFloat64");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        if (isInt32) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3b5,"(!isInt32)","!isInt32");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        if (fromLoopBody) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3b6,"(!fromLoopBody)","!fromLoopBody");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        dblValue = (double)*pArgumentsObject;
        if ((Var)dblValue == (Var)0x0) {
          dblValue = (double)EnsureArguments(this,newInstance,layout,scriptContext,pArgumentsObject)
          ;
        }
        if (dblValue == 0.0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3bc,"(value)","value");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        if ((DAT_01ec73ca & 1) != 0) {
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
          if ((bVar4) &&
             ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
              (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
            Output::Print(L"Arguments object");
          }
        }
      }
      else {
        uVar5 = GetBailOutRegisterSaveSlotCount();
        uVar7 = GetBailOutReserveSlotCount();
        uVar8 = (offset - (uVar5 + uVar7)) - 1;
        if (isInt32) {
          name._4_4_ = Math::PointerCastToIntegralTruncate<int>(this->constants[uVar8]);
        }
        else {
          dblValue = (double)this->constants[uVar8];
        }
        if ((DAT_01ec73ca & 1) != 0) {
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
          if ((bVar4) &&
             ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
              (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
            Output::Print(L"Constant index %4d",(ulong)uVar8);
          }
        }
      }
      bVar4 = false;
    }
    else {
      if (registerSaves == (Var *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x396,"(registerSaves)","registerSaves");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      if (isFloat64) {
        RVar3 = LinearScanMD::GetRegisterFromSaveIndex(offset);
        if (RegTypes[RVar3] != TyFloat64) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x39a,
                             "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64)"
                             ,
                             "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        pvStack_68 = registerSaves[offset + -1];
        if ((DAT_01ec73ca & 1) != 0) {
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
          if ((bVar2) &&
             ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
              (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
            RVar3 = LinearScanMD::GetRegisterFromSaveIndex(offset);
            Output::Print(L"Register %-4S  %4d",RegNames[RVar3],(ulong)(uint)offset);
          }
        }
      }
      else {
        if (isInt32) {
          RVar3 = LinearScanMD::GetRegisterFromSaveIndex(offset);
          if (RegTypes[RVar3] == TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3a6,
                               "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                               ,
                               "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          name._4_4_ = Math::PointerCastToIntegralTruncate<int>(registerSaves[offset + -1]);
        }
        else {
          RVar3 = LinearScanMD::GetRegisterFromSaveIndex(offset);
          if (RegTypes[RVar3] == TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3ab,
                               "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                               ,
                               "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          dblValue = (double)registerSaves[offset + -1];
        }
        if ((DAT_01ec73ca & 1) != 0) {
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
          if ((bVar2) &&
             ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
              (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
            RVar3 = LinearScanMD::GetRegisterFromSaveIndex(offset);
            Output::Print(L"Register %-4S  %4d",RegNames[RVar3],(ulong)(uint)offset);
          }
        }
      }
    }
  }
  if (isFloat64) {
    dblValue = (double)Js::JavascriptNumber::New((double)pvStack_68,scriptContext);
    if ((DAT_01ec73ca & 1) != 0) {
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar4) &&
         ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
        Output::Print(L", value: %f (ToVar: 0x%p)",pvStack_68,dblValue);
      }
    }
  }
  else if (isInt32) {
    if (dblValue != 0.0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x3de,"(!value)","!value");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bVar4 = Js::TaggedInt::IsOverflow(name._4_4_);
    if (bVar4) {
      local_18 = Js::JavascriptNumber::NewInlined((double)(int)name._4_4_,scriptContext);
    }
    else {
      local_18 = Js::TaggedInt::ToVarUnchecked(name._4_4_);
    }
    dblValue = (double)local_18;
    if ((DAT_01ec73ca & 1) != 0) {
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar4) &&
         ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
        Output::Print(L", value: %10d (ToVar: 0x%p)",(ulong)name._4_4_,local_18);
      }
    }
  }
  else {
    pFVar10 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar9 = Js::FunctionBody::GetYieldRegister(pFVar10);
    if (regSlot == RVar9) {
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      bVar2 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)pFVar10);
      if (bVar2) {
        if (dblValue == 0.0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3e6,"(value)","value");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        bVar4 = ThreadContext::IsOnStack((void *)dblValue);
        if (bVar4) {
          if ((DAT_01ec73ca & 1) != 0) {
            pFVar10 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
            pFVar10 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
            if ((bVar4) &&
               ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
                (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4))))
            {
              Output::Print(L", value: 0x%p (Resume Yield Object)",dblValue);
            }
          }
        }
        else if ((DAT_01ec73ca & 1) != 0) {
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
          pFVar10 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
          if ((bVar4) &&
             ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
              (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
            Output::Print(L", value: 0x%p (Yield Return Value)",dblValue);
          }
        }
        goto LAB_0050415d;
      }
    }
    if ((DAT_01ec73ca & 1) != 0) {
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar2) &&
         ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
          (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
        Output::Print(L", value: 0x%p",dblValue);
      }
    }
    if (((bVar4) &&
        (pvVar12 = Js::JavascriptOperators::BoxStackInstance((Var)dblValue,scriptContext,true,false)
        , bVar4 = (Var)dblValue != pvVar12, dblValue = (double)pvVar12, bVar4)) &&
       ((DAT_01ec73ca & 1) != 0)) {
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
      pFVar10 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
      if ((bVar4) &&
         ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
        Output::Print(L" (Boxed: 0x%p)",pvVar12);
      }
    }
  }
LAB_0050415d:
  values[regSlot] = (Var)dblValue;
  if ((DAT_01ec73ca & 1) != 0) {
    pFVar10 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
    pFVar10 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar10);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar6);
    if ((bVar4) &&
       ((bVar4 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar4 ||
        (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar4)))) {
      Output::Print(L"\n");
    }
  }
  return;
}

Assistant:

void
BailOutRecord::RestoreValue(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress,
    uint regSlot, int offset, bool isLocal, bool isFloat64, bool isInt32) const
{
    bool boxStackInstance = true;
    Js::Var value = 0;
    double dblValue = 0.0;
    int32 int32Value = 0;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 const * name = _u("OutParam");
    if (isLocal)
    {
        name = _u("Register");
    }
#endif

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   %s #%3d: "), name, regSlot);

    if (offset < 0)
    {
        // Stack offset are negative
        if (!argoutRestoreAddress)
        {
            if (isFloat64)
            {
                dblValue = layout->GetDoubleAtOffset(offset);
            }
            else if (isInt32)
            {
                int32Value = layout->GetInt32AtOffset(offset);
            }
            else
            {
                value = layout->GetOffset(offset);
                AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                    newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                    value == (Js::Var)Func::c_debugFillPattern),
                    "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");
            }
        }
        else if (!isLocal)
        {
            // If we have:
            // try {
            //      bar(a, b, c);
            // } catch(..) {..}
            // and we bailout during bar args evaluation, we recover from args from argoutRestoreAddress, not from caller function frame.
            // This is because try-catch is implemented as a C wrapper, so args will be a different offset from rbp in that case.
            Assert(!isFloat64 && !isInt32);

            value = *((Js::Var *)(((char *)argoutRestoreAddress) + regSlot * MachPtr));
            AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                value == (Js::Var)Func::c_debugFillPattern),
                "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");

        }

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Stack offset %6d"), offset);
    }
    else if (offset > 0)
    {
        if ((uint)offset <= GetBailOutRegisterSaveSlotCount())
        {
            // Register save space (offset is the register number and index into the register save space)
            // Index is one based, so subtract one
            AssertOrFailFast(registerSaves);

            if (isFloat64)
            {
                Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64);
                dblValue = *((double*)&(registerSaves[offset - 1]));
#ifdef _M_ARM
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[(offset - RegD0) / 2 + RegD0], offset);
#else
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
#endif
            }
            else
            {
                if (isInt32)
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    int32Value = ::Math::PointerCastToIntegralTruncate<int32>(registerSaves[offset - 1]);
                }
                else
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    value = registerSaves[offset - 1];
                }

                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
            }
        }
        else if (BailOutRecord::IsArgumentsObject((uint)offset))
        {
            Assert(!isFloat64);
            Assert(!isInt32);
            Assert(!fromLoopBody);
            value = *pArgumentsObject;
            if (value == nullptr)
            {
                value = EnsureArguments(newInstance, layout, scriptContext, pArgumentsObject);
            }
            Assert(value);
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Arguments object"));
            boxStackInstance = false;
        }
        else
        {
            // Constants offset starts from max bail out register save slot count;
            uint constantIndex = offset - (GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount()) - 1;
            if (isInt32)
            {
                int32Value = ::Math::PointerCastToIntegralTruncate<int32>(this->constants[constantIndex]);
            }
            else
            {
                value = this->constants[constantIndex];
            }
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Constant index %4d"), constantIndex);
            boxStackInstance = false;
        }
    }
    else
    {
        // Consider Assert(false) here
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Not live\n"));
        return;
    }

    if (isFloat64)
    {
        value = Js::JavascriptNumber::New(dblValue, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
    }
    else if (isInt32)
    {
        Assert(!value);
        value = Js::JavascriptNumber::ToVar(int32Value, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else if (regSlot == newInstance->function->GetFunctionBody()->GetYieldRegister() && newInstance->function->GetFunctionBody()->IsCoroutine())
    {
        // This value can only either be a resume yield object created on the heap or
        // an iterator result object created on the heap. No need to box either.
        Assert(value);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (ThreadContext::IsOnStack(value))
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Resume Yield Object)"), value);
        }
        else
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Yield Return Value)"), value);
        }
#endif
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, scriptContext, /* allowStackFunction */ true, /* deepCopy */ false);

            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), value);
            }
        }
    }

    values[regSlot] = value;

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
}